

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O0

void oonf_timer_set_ext(oonf_timer_instance *timer,uint64_t first,uint64_t interval)

{
  uint64_t interval_local;
  uint64_t first_local;
  oonf_timer_instance *timer_local;
  
  if (first == 0) {
    oonf_timer_stop(timer);
  }
  else {
    oonf_timer_start_ext(timer,first,interval);
  }
  return;
}

Assistant:

void
oonf_timer_set_ext(struct oonf_timer_instance *timer, uint64_t first, uint64_t interval) {
  if (first == 0) {
    /* No good future time provided, kill it. */
    oonf_timer_stop(timer);
  }
  else {
    /* Start or restart the timer */
    oonf_timer_start_ext(timer, first, interval);
  }
}